

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O3

auto_ptr<avro::OutputStream> __thiscall avro::memoryOutputStream(avro *this,size_t chunkSize)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = &PTR__MemoryOutputStream_001ce740;
  puVar1[1] = chunkSize;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  *(undefined8 **)this = puVar1;
  return (auto_ptr<avro::OutputStream>)(OutputStream *)this;
}

Assistant:

std::auto_ptr<OutputStream> memoryOutputStream(size_t chunkSize)
{
    return std::auto_ptr<OutputStream>(new MemoryOutputStream(chunkSize));
}